

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-prefs.c
# Opt level: O2

void dump_ui_entry_renderers(ang_file *fff)

{
  wchar_t wVar1;
  wchar_t ind;
  char *str;
  char *str_00;
  char *p;
  char *pcVar2;
  
  wVar1 = ui_entry_renderer_get_index_limit();
  file_putf(fff,"# Renderers for parts of the character screen.\n");
  file_putf(fff,"# Format entry-renderer:name:colors:label_colors:symbols\n");
  file_putf(fff,"# Use * for colors or label_colors to leave those unchanged\n");
  file_putf(fff,"# Leave off symbols and the colon before it to leave those unchanged\n");
  file_putf(fff,"# Look at lib/gamedata/ui_entry_renderers.txt for more information\n");
  file_putf(fff,"# about how colors, label_colors, and symbols are used\n");
  for (ind = ui_entry_renderer_get_min_index(); ind < wVar1; ind = ind + L'\x01') {
    str = ui_entry_renderer_get_colors(ind);
    str_00 = ui_entry_renderer_get_label_colors(ind);
    p = ui_entry_renderer_get_symbols(ind);
    pcVar2 = ui_entry_renderer_get_name(ind);
    file_putf(fff,"entry-renderer:%s:%s:%s:%s\n",pcVar2,str,str_00,p);
    mem_free(p);
    string_free(str_00);
    string_free(str);
  }
  return;
}

Assistant:

void dump_ui_entry_renderers(ang_file *fff)
{
	int n = ui_entry_renderer_get_index_limit(), i;

	file_putf(fff, "# Renderers for parts of the character screen.\n");
	file_putf(fff, "# Format entry-renderer:name:colors:label_colors:symbols\n");
	file_putf(fff, "# Use * for colors or label_colors to leave those unchanged\n");
	file_putf(fff, "# Leave off symbols and the colon before it to leave those unchanged\n");
	file_putf(fff, "# Look at lib/gamedata/ui_entry_renderers.txt for more information\n");
	file_putf(fff, "# about how colors, label_colors, and symbols are used\n");

	for (i = ui_entry_renderer_get_min_index(); i < n; i++) {
		char* colors = ui_entry_renderer_get_colors(i);
		char* labcolors = ui_entry_renderer_get_label_colors(i);
		char* symbols = ui_entry_renderer_get_symbols(i);

		file_putf(fff, "entry-renderer:%s:%s:%s:%s\n",
			ui_entry_renderer_get_name(i), colors, labcolors,
			symbols);
		mem_free(symbols);
		string_free(labcolors);
		string_free(colors);
	}
}